

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O1

Rpo_LCI_Edge_t * Rpo_CreateEdge(Operator_t op,int i,int j,int *vertexDegree)

{
  Rpo_LCI_Edge_t *pRVar1;
  
  pRVar1 = (Rpo_LCI_Edge_t *)malloc(8);
  *pRVar1 = (Rpo_LCI_Edge_t)
            ((ulong)(i & 0x3fffffff) * 0x10 + (ulong)(op & LIT_XOR) * 2 | (long)j << 0x22 |
            (ulong)(SUB84(*pRVar1,0) & 8));
  vertexDegree[i] = vertexDegree[i] + 1;
  vertexDegree[j] = vertexDegree[j] + 1;
  return pRVar1;
}

Assistant:

Rpo_LCI_Edge_t* Rpo_CreateEdge(Operator_t op, int i, int j, int* vertexDegree) {
    Rpo_LCI_Edge_t* edge = ABC_ALLOC(Rpo_LCI_Edge_t, 1);
    edge->connectionType = op;
    edge->idx1 = i;
    edge->idx2 = j;
    edge->visited = 0;
    vertexDegree[i]++;
    vertexDegree[j]++;
    return edge;
}